

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *
google::protobuf::internal::MapKeySorter::SortKey
          (Message *message,Reflection *reflection,FieldDescriptor *field)

{
  iterator iVar1;
  iterator iVar2;
  value_type *in_RDI;
  MapKeyComparator comparator;
  MapIterator it;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *sorted_key_list;
  MapIterator *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff37;
  value_type *this;
  FieldDescriptor *in_stack_ffffffffffffff58;
  Message *in_stack_ffffffffffffff60;
  Reflection *in_stack_ffffffffffffff68;
  MapIterator local_58;
  undefined1 local_21;
  
  local_21 = 0;
  this = in_RDI;
  std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::vector
            ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)0x474e01
            );
  Reflection::MapBegin
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  while( true ) {
    Reflection::MapEnd(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                      );
    in_stack_ffffffffffffff37 =
         protobuf::operator!=
                   ((MapIterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
    MapIterator::~MapIterator
              ((MapIterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    if ((in_stack_ffffffffffffff37 & 1) == 0) break;
    in_stack_ffffffffffffff28 = (MapIterator *)MapIterator::GetKey(&local_58);
    std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::push_back
              ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)this,
               in_RDI);
    MapIterator::operator++
              ((MapIterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  }
  MapIterator::~MapIterator
            ((MapIterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  iVar1 = std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::begin
                    ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                     in_stack_ffffffffffffff28);
  iVar2 = std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::end
                    ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                     in_stack_ffffffffffffff28);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,google::protobuf::internal::MapKeySorter::MapKeyComparator>
            (iVar1._M_current,iVar2._M_current);
  return (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)this;
}

Assistant:

static std::vector<MapKey> SortKey(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field) {
    std::vector<MapKey> sorted_key_list;
    for (MapIterator it =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         it != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++it) {
      sorted_key_list.push_back(it.GetKey());
    }
    MapKeyComparator comparator;
    std::sort(sorted_key_list.begin(), sorted_key_list.end(), comparator);
    return sorted_key_list;
  }